

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void set_cb_buffer(AV1Decoder *pbi,DecoderCodingBlock *dcb,CB_BUFFER *cb_buffer_base,int num_planes,
                  int mi_row,int mi_col)

{
  CB_BUFFER *pCVar1;
  byte bVar2;
  ulong uVar3;
  eob_info *peVar4;
  ulong uVar5;
  CB_BUFFER *pCVar6;
  int iVar7;
  
  bVar2 = (byte)((pbi->common).seq_params)->mib_size_log2;
  iVar7 = (mi_col >> (bVar2 & 0x1f)) +
          (mi_row >> (bVar2 & 0x1f)) * (((pbi->common).mi_params.mi_cols >> (bVar2 & 0x1f)) + 1);
  pCVar1 = cb_buffer_base + iVar7;
  peVar4 = cb_buffer_base[iVar7].eob_data[0];
  uVar5 = 0;
  pCVar6 = pCVar1;
  uVar3 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    dcb->dqcoeff_block[uVar5] = (tran_low_t *)pCVar6;
    dcb->eob_data[uVar5] = peVar4;
    dcb->cb_offset[uVar5] = 0;
    dcb->txb_offset[uVar5] = 0;
    peVar4 = peVar4 + 0x400;
    pCVar6 = (CB_BUFFER *)(pCVar6->dqcoeff + 1);
  }
  (dcb->xd).plane[0].color_index_map = pCVar1->color_index_map[0];
  (dcb->xd).plane[1].color_index_map = pCVar1->color_index_map[1];
  (dcb->xd).color_index_map_offset[0] = 0;
  (dcb->xd).color_index_map_offset[1] = 0;
  return;
}

Assistant:

static inline void set_cb_buffer(AV1Decoder *pbi, DecoderCodingBlock *dcb,
                                 CB_BUFFER *cb_buffer_base,
                                 const int num_planes, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &pbi->common;
  int mib_size_log2 = cm->seq_params->mib_size_log2;
  int stride = (cm->mi_params.mi_cols >> mib_size_log2) + 1;
  int offset = (mi_row >> mib_size_log2) * stride + (mi_col >> mib_size_log2);
  CB_BUFFER *cb_buffer = cb_buffer_base + offset;

  for (int plane = 0; plane < num_planes; ++plane) {
    dcb->dqcoeff_block[plane] = cb_buffer->dqcoeff[plane];
    dcb->eob_data[plane] = cb_buffer->eob_data[plane];
    dcb->cb_offset[plane] = 0;
    dcb->txb_offset[plane] = 0;
  }
  MACROBLOCKD *const xd = &dcb->xd;
  xd->plane[0].color_index_map = cb_buffer->color_index_map[0];
  xd->plane[1].color_index_map = cb_buffer->color_index_map[1];
  xd->color_index_map_offset[0] = 0;
  xd->color_index_map_offset[1] = 0;
}